

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O1

bool __thiscall
Centaurus::DFA<char>::run
          (DFA<char> *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *seq,
          int index,int input_pos)

{
  pointer pNVar1;
  pointer pRVar2;
  bool bVar3;
  byte bVar4;
  pointer pRVar6;
  NFATransition<char> *tr;
  pointer pNVar7;
  bool bVar8;
  pointer pDVar5;
  
  pDVar5 = (this->super_NFABase<Centaurus::DFAState<char>_>).m_states.
           super__Vector_base<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>
           ._M_impl.super__Vector_impl_data._M_start + index;
  if (seq->_M_string_length == (long)input_pos) {
    bVar4 = pDVar5->m_accept;
  }
  else {
    pNVar7 = (pDVar5->super_NFABaseState<char,_Centaurus::IndexVector>).m_transitions.
             super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar1 = *(pointer *)
              ((long)&(pDVar5->super_NFABaseState<char,_Centaurus::IndexVector>).m_transitions.
                      super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
              + 8);
    if (pNVar7 != pNVar1) {
      do {
        pRVar6 = (pNVar7->m_label).m_ranges.
                 super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pRVar2 = *(pointer *)
                  ((long)&(pNVar7->m_label).m_ranges.
                          super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                  + 8);
        bVar8 = pRVar6 != pRVar2;
        if (bVar8) {
          bVar4 = (seq->_M_dataplus)._M_p[input_pos];
          do {
            if (((byte)pRVar6->m_start <= bVar4) && (bVar4 < (byte)pRVar6->m_end)) break;
            pRVar6 = pRVar6 + 1;
            bVar8 = pRVar6 != pRVar2;
          } while (bVar8);
        }
        if (bVar8) {
          bVar3 = run(this,seq,pNVar7->m_dest,input_pos + 1);
          pDVar5 = (pointer)(ulong)bVar3;
        }
        bVar4 = (byte)pDVar5;
        if (bVar8) goto LAB_00118794;
        pNVar7 = pNVar7 + 1;
      } while (pNVar7 != pNVar1);
    }
    bVar4 = 0;
  }
LAB_00118794:
  return (bool)(bVar4 & 1);
}

Assistant:

bool run(const std::basic_string<TCHAR>& seq, int index = 0, int input_pos = 0) const
	{
		const DFAState<TCHAR>& state = m_states[index];
		if (input_pos == seq.size())
		{
			return state.is_accept();
		}
		else
		{
			for (const auto& tr : state.get_transitions())
			{
				if (tr.label().includes(seq[input_pos]))
				{
					return run(seq, tr.dest(), input_pos + 1);
				}
			}
			return false;
		}
	}